

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_ce.cpp
# Opt level: O1

void msd_CE2_16bit(uchar **strings,size_t n,size_t depth)

{
  uchar *puVar1;
  uchar *puVar2;
  int iVar3;
  size_t i_1;
  void *__ptr;
  void *__src;
  long lVar4;
  ushort uVar5;
  uchar **ppuVar6;
  uchar **ppuVar7;
  byte bVar8;
  byte bVar9;
  ulong uVar10;
  size_t i;
  size_t sVar11;
  ulong n_00;
  uint16_t bucketsize [256];
  uint16_t bucketindex [256];
  ushort local_438 [256];
  ushort local_238 [260];
  
  if (n < 0x20) {
    if (1 < (long)n) {
      ppuVar6 = strings;
      do {
        iVar3 = (int)n;
        n = (size_t)(iVar3 - 1);
        puVar1 = ppuVar6[1];
        ppuVar6 = ppuVar6 + 1;
        for (ppuVar7 = ppuVar6; strings < ppuVar7; ppuVar7 = ppuVar7 + -1) {
          puVar2 = ppuVar7[-1];
          bVar8 = puVar2[depth];
          bVar9 = puVar1[depth];
          if ((bVar8 != 0) && (lVar4 = depth + 1, bVar8 == bVar9)) {
            do {
              bVar8 = puVar2[lVar4];
              bVar9 = puVar1[lVar4];
              if (bVar8 == 0) break;
              lVar4 = lVar4 + 1;
            } while (bVar8 == bVar9);
          }
          if (bVar8 <= bVar9) break;
          *ppuVar7 = puVar2;
        }
        *ppuVar7 = puVar1;
      } while (2 < iVar3);
    }
  }
  else {
    sVar11 = 0;
    memset(local_438,0,0x200);
    __ptr = malloc(n);
    do {
      *(uchar *)((long)__ptr + sVar11) = strings[sVar11][depth];
      sVar11 = sVar11 + 1;
    } while (n != sVar11);
    sVar11 = 0;
    do {
      local_438[*(byte *)((long)__ptr + sVar11)] = local_438[*(byte *)((long)__ptr + sVar11)] + 1;
      sVar11 = sVar11 + 1;
    } while (n != sVar11);
    __src = malloc(n * 8);
    local_238[0] = 0;
    lVar4 = 1;
    uVar5 = 0;
    do {
      uVar5 = uVar5 + local_438[lVar4 + -1];
      local_238[lVar4] = uVar5;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x100);
    sVar11 = 0;
    do {
      puVar1 = strings[sVar11];
      uVar5 = local_238[*(byte *)((long)__ptr + sVar11)];
      local_238[*(byte *)((long)__ptr + sVar11)] = uVar5 + 1;
      *(uchar **)((long)__src + (ulong)uVar5 * 8) = puVar1;
      sVar11 = sVar11 + 1;
    } while (n != sVar11);
    memcpy(strings,__src,n * 8);
    free(__src);
    free(__ptr);
    uVar10 = (ulong)local_438[0];
    lVar4 = 1;
    do {
      n_00 = (ulong)local_438[lVar4];
      if (n_00 != 0) {
        msd_CE2_16bit(strings + uVar10,n_00,depth + 1);
        uVar10 = uVar10 + n_00;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x100);
  }
  return;
}

Assistant:

void
msd_CE2_16bit(unsigned char** strings, size_t n, size_t depth)
{
	if (n < 32) {
		insertion_sort(strings, n, depth);
		return;
	}
	uint16_t bucketsize[256] = {0};
	unsigned char* restrict oracle =
		(unsigned char*) malloc(n);
	for (size_t i=0; i < n; ++i)
		oracle[i] = strings[i][depth];
	for (size_t i=0; i < n; ++i)
		++bucketsize[oracle[i]];
	unsigned char** restrict sorted = (unsigned char**)
		malloc(n*sizeof(unsigned char*));
	uint16_t bucketindex[256];
	bucketindex[0] = 0;
	for (size_t i=1; i < 256; ++i)
		bucketindex[i] = bucketindex[i-1]+bucketsize[i-1];
	for (size_t i=0; i < n; ++i)
		sorted[bucketindex[oracle[i]]++] = strings[i];
	memcpy(strings, sorted, n*sizeof(unsigned char*));
	free(sorted);
	free(oracle);
	size_t bsum = bucketsize[0];
	for (size_t i=1; i < 256; ++i) {
		if (bucketsize[i] == 0) continue;
		msd_CE2_16bit(strings+bsum, bucketsize[i], depth+1);
		bsum += bucketsize[i];
	}
}